

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O0

bool clusterSimple(TSimilarityMap *sim,TValueCC tholdCC,TKeyPressCollection *keyPresses)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  TClusterId *pTVar4;
  TClusterId *pTVar5;
  const_reference this;
  const_reference pvVar6;
  reference pvVar7;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RSI;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDI;
  float fVar8;
  double in_XMM0_Qa;
  TClusterId *jcid_1;
  int j_1;
  TClusterId *icid_2;
  int i_3;
  TClusterId *icid_1;
  int i_2;
  float r;
  TValueCC *cc;
  TClusterId *jcid;
  TClusterId *icid;
  int j;
  int i_1;
  int iter;
  int nIter;
  int curId;
  TClusterId *cid;
  int i;
  int n;
  int local_7c;
  int local_6c;
  int local_60;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_20;
  
  sVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RSI);
  iVar1 = (int)sVar2;
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RSI,(long)local_20);
    pvVar3->cid = 0;
  }
  local_2c = 0;
  for (local_34 = 0; local_34 < 1000000; local_34 = local_34 + 1) {
    local_38 = rand();
    local_3c = rand();
    while( true ) {
      local_38 = local_38 % iVar1;
      local_3c = local_3c % iVar1;
      if (local_38 != local_3c) break;
      local_38 = rand();
      local_3c = rand();
    }
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RSI,(long)local_38);
    pTVar4 = &pvVar3->cid;
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RSI,(long)local_3c);
    pTVar5 = &pvVar3->cid;
    this = std::
           vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           ::operator[](in_RDI,(long)local_38);
    pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](this,(long)local_3c);
    if ((in_XMM0_Qa <= pvVar6->cc) && (fVar8 = frand(), (double)fVar8 < pvVar6->cc)) {
      if ((*pTVar4 == *pTVar5) && (*pTVar4 == 0)) {
        local_2c = local_2c + 1;
        *pTVar5 = local_2c;
        *pTVar4 = local_2c;
      }
      else if (*pTVar4 == 0) {
        *pTVar4 = *pTVar5;
      }
      else {
        *pTVar5 = *pTVar4;
      }
    }
  }
  for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RSI,(long)local_60);
    pTVar4 = &pvVar3->cid;
    if (*pTVar4 == 0) {
      local_2c = local_2c + 1;
      *pTVar4 = local_2c;
    }
    *pTVar4 = -*pTVar4;
  }
  local_2c = 0;
  for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RSI,(long)local_6c);
    if (pvVar3->cid < 1) {
      for (local_7c = local_6c; local_7c < iVar1; local_7c = local_7c + 1) {
        pvVar7 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](in_RSI,(long)local_7c);
        if (pvVar7->cid == pvVar3->cid) {
          pvVar7->cid = local_2c;
        }
      }
      local_2c = local_2c + 1;
    }
  }
  return true;
}

Assistant:

bool clusterSimple(const TSimilarityMap & sim, TValueCC tholdCC, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = 0;
    }

    int curId = 0;

    int nIter = 1000000;
    for (int iter = 0; iter < nIter; ++iter) {
        int i = rand()%n;
        int j = rand()%n;
        while (i == j) {
            i = rand()%n;
            j = rand()%n;
        }

        auto & icid = keyPresses[i].cid;
        auto & jcid = keyPresses[j].cid;

        //if (icid != 0 && jcid != 0) continue;

        auto & cc = sim[i][j].cc;

        if (cc < tholdCC) continue;
        auto r = frand();
        if (r < cc) {
            if (icid == jcid && icid == 0) {
                icid = jcid = ++curId;
            } else if (icid == 0) {
                icid = jcid;
            } else {
                jcid = icid;
            }
        }

        //if (icid == jcid) {
        //    //if (std::pow(r, 1.0) > cc) {
        //    //    icid = i + 1;
        //    //    jcid = j + 1;
        //    //}
        //} else {
        //    if (std::pow(r, 1.0) < cc) {
        //        icid = jcid;
        //    }
        //}
    }

    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid == 0) icid = ++curId;
        icid = -icid;
    }

    curId = 0;
    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid > 0) continue;
        for (int j = i; j < n; ++j) {
            auto & jcid = keyPresses[j].cid;

            if (jcid == icid) {
                jcid = curId;
            }
        }
        ++curId;
    }

    return true;
}